

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

string * wallet::EncodeDumpString(string *str)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  string *in_RDI;
  long in_FS_OFFSET;
  string *__range1;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  stringstream ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  string local_1b0 [16];
  Span<const_unsigned_char> in_stack_fffffffffffffe60;
  stringstream local_190 [16];
  ostream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_190);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
            (in_stack_fffffffffffffdd8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_fffffffffffffde8);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffdd8);
    bVar1 = *pbVar3;
    if (((bVar1 < 0x21) || (0x7f < bVar1)) || (bVar1 == 0x25)) {
      in_stack_fffffffffffffde8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(local_180,'%');
      Span<const_unsigned_char>::Span<const_unsigned_char,_0>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffde8,
                 (uchar *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
      HexStr_abi_cxx11_(in_stack_fffffffffffffe60);
      std::operator<<((ostream *)in_stack_fffffffffffffde8,local_1b0);
      std::__cxx11::string::~string(in_stack_fffffffffffffdd8);
    }
    else {
      std::operator<<(local_180,bVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffdd8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string static EncodeDumpString(const std::string &str) {
    std::stringstream ret;
    for (const unsigned char c : str) {
        if (c <= 32 || c >= 128 || c == '%') {
            ret << '%' << HexStr({&c, 1});
        } else {
            ret << c;
        }
    }
    return ret.str();
}